

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOMPI.cpp
# Opt level: O0

shared_ptr<adios2::core::Engine>
adios2::core::anon_unknown_4::MakeEngineMPI<adios2::core::engine::SscWriter>
          (IO *io,string *name,Mode mode,Comm *comm)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RDI;
  Comm *in_R8;
  shared_ptr<adios2::core::Engine> sVar2;
  Comm *this;
  undefined8 in_stack_fffffffffffffee8;
  allocator *paVar3;
  Mode mode_00;
  string *in_stack_fffffffffffffef0;
  allocator *in_stack_fffffffffffffef8;
  int commRank;
  string *message;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  undefined1 local_a9 [40];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [72];
  
  mode_00 = (Mode)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  message = in_RDI;
  uVar1 = adios2::helper::Comm::IsMPI();
  commRank = (int)((ulong)in_RDI >> 0x20);
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Core",&local_49);
    in_stack_fffffffffffffef8 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"IOMPI",in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef0 = (string *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a9 + 1),"MakeEngineMPI",(allocator *)in_stack_fffffffffffffef0);
    paVar3 = (allocator *)&stack0xffffffffffffff2f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff30,
               "A MPI-only engine cannot be used with a communicator that is not MPI-based.",paVar3)
    ;
    mode_00 = (Mode)((ulong)paVar3 >> 0x20);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,message
               ,commRank);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  this = (Comm *)&stack0xffffffffffffff20;
  adios2::helper::Comm::Comm(this,in_R8);
  IO::MakeEngine<adios2::core::engine::SscWriter>
            ((IO *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,mode_00,this);
  adios2::helper::Comm::~Comm((Comm *)&stack0xffffffffffffff20);
  sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)message;
  return (shared_ptr<adios2::core::Engine>)
         sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Engine> MakeEngineMPI(IO &io, const std::string &name, const Mode mode,
                                      helper::Comm comm)
{
    if (!comm.IsMPI())
    {
        helper::Throw<std::invalid_argument>("Core", "IOMPI", "MakeEngineMPI",
                                             "A MPI-only engine cannot be used with a "
                                             "communicator that is not MPI-based.");
    }
    return IO::MakeEngine<T>(io, name, mode, std::move(comm));
}